

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O0

rtr_mgr_group * get_best_inactive_rtr_mgr_group(rtr_mgr_config *config,rtr_mgr_group *group)

{
  long lVar1;
  long in_FS_OFFSET;
  rtr_mgr_group *current_group;
  rtr_mgr_group_node *group_node;
  tommy_node *node;
  rtr_mgr_group *group_local;
  rtr_mgr_config *config_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pthread_rwlock_rdlock((pthread_rwlock_t *)&config->mutex);
  group_node = (rtr_mgr_group_node *)tommy_list_head(&config->groups->list);
  do {
    if (group_node == (rtr_mgr_group_node *)0x0) {
      pthread_rwlock_unlock((pthread_rwlock_t *)&config->mutex);
      config_local = (rtr_mgr_config *)0x0;
LAB_001059a6:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return (rtr_mgr_group *)config_local;
      }
      __stack_chk_fail();
    }
    config_local = *(rtr_mgr_config **)((long)(group_node->node).data + 0x20);
    if ((config_local != (rtr_mgr_config *)group) &&
       ((config_local->mutex).__data.__readers == RTR_MGR_CLOSED)) {
      pthread_rwlock_unlock((pthread_rwlock_t *)&config->mutex);
      goto LAB_001059a6;
    }
    group_node = (rtr_mgr_group_node *)(group_node->node).next;
  } while( true );
}

Assistant:

static struct rtr_mgr_group *get_best_inactive_rtr_mgr_group(struct rtr_mgr_config *config, struct rtr_mgr_group *group)
{
	pthread_rwlock_rdlock(&config->mutex);
	tommy_node *node = tommy_list_head(&config->groups->list);

	while (node) {
		struct rtr_mgr_group_node *group_node = node->data;
		struct rtr_mgr_group *current_group = group_node->group;

		if ((current_group != group) && (current_group->status == RTR_MGR_CLOSED)) {
			pthread_rwlock_unlock(&config->mutex);
			return current_group;
		}
		node = node->next;
	}
	pthread_rwlock_unlock(&config->mutex);
	return NULL;
}